

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool operator!=(ON_SurfaceDraftAngleColorMapping *lhs,ON_SurfaceDraftAngleColorMapping *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  bool bVar10;
  ON_3dVector up [2];
  ON_3dVector local_48;
  ON_3dVector local_30;
  
  local_48.z = (lhs->m_up).z;
  local_48.x = (lhs->m_up).x;
  local_48.y = (lhs->m_up).y;
  local_30.x = (rhs->m_up).x;
  local_30.y = (rhs->m_up).y;
  local_30.z = (rhs->m_up).z;
  bVar10 = ON_3dVector::operator!=(&local_48,&local_30);
  if (!bVar10) {
    return false;
  }
  dVar1 = (lhs->m_angle_range_in_radians).m_t[0];
  dVar2 = (lhs->m_angle_range_in_radians).m_t[1];
  dVar3 = (rhs->m_angle_range_in_radians).m_t[0];
  dVar4 = (rhs->m_angle_range_in_radians).m_t[1];
  bVar9 = true;
  if ((((dVar1 != dVar3) || (NAN(dVar1) || NAN(dVar3))) || (dVar2 != dVar4)) ||
     (NAN(dVar2) || NAN(dVar4))) {
    dVar5 = (lhs->m_hue_range_in_radians).m_t[0];
    dVar6 = (lhs->m_hue_range_in_radians).m_t[1];
    dVar7 = (rhs->m_hue_range_in_radians).m_t[0];
    dVar8 = (rhs->m_hue_range_in_radians).m_t[1];
    if ((dVar5 == dVar7) && (!NAN(dVar5) && !NAN(dVar7))) {
      if ((dVar6 == dVar8) && (!NAN(dVar6) && !NAN(dVar8))) goto LAB_00517ccc;
    }
    bVar10 = false;
    bVar9 = false;
    if (((!NAN(dVar1)) && (bVar9 = bVar10, !NAN(dVar2))) && (!NAN(dVar3))) {
      bVar9 = false;
      if (NAN(dVar4)) goto LAB_00517ccc;
      bVar9 = (bool)((!NAN(dVar8) && !NAN(dVar7)) & -!NAN(dVar5) & -!NAN(dVar6));
    }
    bVar10 = bVar9;
    bVar9 = false;
  }
LAB_00517ccc:
  if (bVar9) {
    return false;
  }
  return bVar10;
}

Assistant:

bool operator!=(const ON_SurfaceDraftAngleColorMapping& lhs, const ON_SurfaceDraftAngleColorMapping& rhs)
{
  // if any double is a nan, this compare must be false.
  const ON_3dVector up[2] = { lhs.Up(), rhs.Up() };
  if (up[0] != up[1])
  {
    const ON_Interval ar[2] = { lhs.AngleRangeInRadians() ,rhs.AngleRangeInRadians() };
    if (ar[0].m_t[0] != ar[1].m_t[0] || ar[0].m_t[1] != ar[1].m_t[1])
    {
      const ON_Interval hr[2] = { lhs.HueRangeInRadians() ,rhs.HueRangeInRadians() };
      if (hr[0].m_t[0] != hr[1].m_t[0] || hr[0].m_t[1] != hr[1].m_t[1])
      {
        // any compare involving nans is false
        if (ON_IS_NAN(ar[0].m_t[0]) || ON_IS_NAN(ar[0].m_t[1]) || ON_IS_NAN(ar[1].m_t[0]) || ON_IS_NAN(ar[1].m_t[1]))
          return false;
        if (ON_IS_NAN(hr[0].m_t[0]) || ON_IS_NAN(hr[0].m_t[1]) || ON_IS_NAN(hr[1].m_t[0]) || ON_IS_NAN(hr[1].m_t[1]))
          return false;

        return true;
      }
    }
  }
  return false;
}